

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O2

int ConvexDecomposition::overhull
              (Plane *planes,int planes_count,float3 *verts,int verts_count,int maxplanes,
              float3 **verts_out,int *verts_count_out,int **faces_out,int *faces_count_out,
              float inflate)

{
  uchar uVar1;
  byte bVar2;
  undefined8 this;
  float3 **ppfVar3;
  ConvexH *convex;
  float3 *pfVar4;
  ConvexH *convex_00;
  float *pfVar5;
  HalfEdge *pHVar6;
  float3 *pfVar7;
  int iVar8;
  long lVar9;
  int i;
  float fVar10;
  int j;
  int iVar11;
  float fVar12;
  Plane *b;
  int p;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  bool bVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar20 [64];
  undefined1 auVar22 [56];
  undefined1 auVar21 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float3 fVar26;
  float3 local_b8;
  float3 local_a8;
  float local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 local_88 [16];
  Plane *local_70;
  float local_68;
  float local_64;
  float3 **local_60;
  ulong local_58;
  float3 local_50;
  float3 local_40;
  
  auVar20._4_60_ = in_register_00001204;
  auVar20._0_4_ = inflate;
  local_88 = auVar20._0_16_;
  iVar11 = 0;
  if (3 < verts_count) {
    local_a8.z = verts->z;
    uVar13 = (ulong)(uint)verts_count;
    local_a8.x = verts->x;
    local_a8.y = verts->y;
    local_b8.z = verts->z;
    local_b8.x = verts->x;
    local_b8.y = verts->y;
    local_98 = (float)maxplanes;
    local_70 = planes;
    local_60 = verts_out;
    while( true ) {
      auVar22 = auVar20._8_56_;
      bVar16 = uVar13 == 0;
      uVar13 = uVar13 - 1;
      if (bVar16) break;
      fVar26 = VectorMin(&local_a8,verts);
      local_a8.z = fVar26.z;
      auVar21._0_8_ = fVar26._0_8_;
      auVar21._8_56_ = auVar22;
      local_a8._0_8_ = vmovlps_avx(auVar21._0_16_);
      fVar26 = VectorMax(&local_b8,verts);
      local_b8.z = fVar26.z;
      auVar20._0_8_ = fVar26._0_8_;
      auVar20._8_56_ = auVar22;
      local_b8._0_8_ = vmovlps_avx(auVar20._0_16_);
      verts = verts + 1;
    }
    lVar9 = 0;
    local_58 = (ulong)(uint)(~(planes_count >> 0x1f) & planes_count);
    local_a8.z = local_a8.z - (float)local_88._0_4_;
    auVar24._4_4_ = local_88._0_4_;
    auVar24._0_4_ = local_88._0_4_;
    auVar24._8_4_ = local_88._0_4_;
    auVar24._12_4_ = local_88._0_4_;
    auVar25._0_4_ = local_b8.x + (float)local_88._0_4_;
    auVar25._4_4_ = local_b8.y + (float)local_88._0_4_;
    auVar25._8_4_ = (float)local_88._0_4_ + 0.0;
    auVar25._12_4_ = (float)local_88._0_4_ + 0.0;
    auVar19._8_8_ = 0;
    auVar19._0_4_ = local_a8.x;
    auVar19._4_4_ = local_a8.y;
    local_b8._0_8_ = vmovlps_avx(auVar25);
    auVar19 = vsubps_avx(auVar19,auVar24);
    local_b8.z = (float)local_88._0_4_ + local_b8.z;
    local_a8._0_8_ = vmovlps_avx(auVar19);
    for (; local_58 << 4 != lVar9; lVar9 = lVar9 + 0x10) {
      *(float *)((long)&local_70->dist + lVar9) =
           *(float *)((long)&local_70->dist + lVar9) - (float)local_88._0_4_;
    }
    auVar19 = vsubps_avx(auVar25,auVar19);
    if ((int)local_98 < planes_count) {
      planes_count = (int)local_98;
    }
    auVar23._0_4_ = auVar19._0_4_ * auVar19._0_4_;
    auVar23._4_4_ = auVar19._4_4_ * auVar19._4_4_;
    auVar23._8_4_ = auVar19._8_4_ * auVar19._8_4_;
    auVar23._12_4_ = auVar19._12_4_ * auVar19._12_4_;
    auVar19 = vhaddps_avx(auVar23,auVar23);
    auVar19 = ZEXT416((uint)(auVar19._0_4_ + (local_b8.z - local_a8.z) * (local_b8.z - local_a8.z)))
    ;
    auVar19 = vsqrtss_avx(auVar19,auVar19);
    local_68 = auVar19._0_4_ * 0.025;
    planetestepsilon = auVar19._0_4_ * 0.001;
    local_50._0_8_ = local_b8._0_8_;
    local_50.z = local_b8.z;
    local_40._0_8_ = local_a8._0_8_;
    local_40.z = local_a8.z;
    convex = ConvexHMakeCube(&local_40,&local_50);
    while (local_64 = (float)(planes_count + -1), (float)planes_count != 0.0) {
      uVar14 = 0;
      local_98 = 0.0;
      uStack_94 = 0;
      uStack_90 = 0;
      uStack_8c = 0;
      for (uVar13 = 0; uVar13 != local_58; uVar13 = uVar13 + 1) {
        b = local_70 + uVar13;
        auVar19 = ZEXT816(0) << 0x40;
        iVar11 = 0;
        while (iVar11 < (convex->vertices).count) {
          local_88 = auVar19;
          pfVar4 = Array<ConvexDecomposition::float3>::operator[](&convex->vertices,iVar11);
          fVar18 = dot(pfVar4,&b->normal);
          iVar11 = iVar11 + 1;
          auVar19 = vmaxss_avx(local_88,ZEXT416((uint)(fVar18 + b->dist)));
        }
        bVar17 = uVar13 == 0;
        bVar16 = local_98 < auVar19._0_4_;
        if (bVar16 || bVar17) {
          uVar14 = uVar13 & 0xffffffff;
        }
        local_98 = (float)((uint)(bVar16 || bVar17) * (int)auVar19._0_4_ +
                          (uint)(!bVar16 && !bVar17) * (int)local_98);
      }
      if (local_98 <= local_68) {
        uVar14 = 0xffffffff;
      }
      if ((int)uVar14 < 0) break;
      convex_00 = ConvexHCrop(convex,local_70 + uVar14);
      if (convex_00 == (ConvexH *)0x0) break;
      iVar11 = AssertIntact(convex_00);
      if (iVar11 == 0) break;
      ConvexH::~ConvexH(convex);
      ::operator_delete(convex,0x30);
      convex = convex_00;
      planes_count = (int)local_64;
    }
    iVar11 = AssertIntact(convex);
    if (iVar11 == 0) {
      __assert_fail("AssertIntact(*c)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                    ,0xa6f,
                    "int ConvexDecomposition::overhull(Plane *, int, float3 *, int, int, float3 *&, int &, int *&, int &, float)"
                   );
    }
    local_88._0_8_ = &convex->edges;
    pfVar5 = (float *)malloc(((long)(convex->edges).count + (long)(convex->facets).count) * 4 + 4);
    fVar18 = 0.0;
    *faces_out = (int *)pfVar5;
    *faces_count_out = 1;
    *pfVar5 = -NAN;
    iVar11 = 0;
    while (ppfVar3 = local_60, iVar8 = (convex->edges).count, iVar11 < iVar8) {
      uStack_94 = 0;
      local_98 = fVar18;
      for (fVar12 = 1.4013e-45; iVar11 + (int)fVar12 < iVar8; fVar12 = (float)((int)fVar12 + 1)) {
        this = local_88._0_8_;
        pHVar6 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[]
                           ((Array<ConvexDecomposition::ConvexH::HalfEdge> *)local_88._0_8_,iVar11);
        uVar1 = pHVar6->p;
        pHVar6 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[]
                           ((Array<ConvexDecomposition::ConvexH::HalfEdge> *)this,
                            iVar11 + (int)fVar12);
        if (uVar1 != pHVar6->p) break;
        iVar8 = (convex->edges).count;
      }
      iVar8 = *faces_count_out;
      pfVar5 = (float *)*faces_out;
      *faces_count_out = iVar8 + 1;
      pfVar5[iVar8] = fVar12;
      for (fVar10 = 0.0; fVar12 != fVar10; fVar10 = (float)((int)fVar10 + 1)) {
        pHVar6 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[]
                           ((Array<ConvexDecomposition::ConvexH::HalfEdge> *)local_88._0_8_,
                            iVar11 + (int)fVar10);
        iVar8 = *faces_count_out;
        bVar2 = pHVar6->v;
        pfVar5 = (float *)*faces_out;
        *faces_count_out = iVar8 + 1;
        pfVar5[iVar8] = (float)(uint)bVar2;
      }
      fVar18 = (float)((int)local_98 + 1);
      iVar11 = iVar11 + (int)fVar10;
    }
    *pfVar5 = fVar18;
    if (fVar18 != (float)(convex->facets).count) {
      __assert_fail("k==c->facets.count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                    ,0xa83,
                    "int ConvexDecomposition::overhull(Plane *, int, float3 *, int, int, float3 *&, int &, int *&, int &, float)"
                   );
    }
    if (*faces_count_out != (int)fVar18 + 1 + (convex->edges).count) {
      __assert_fail("faces_count_out == 1+c->facets.count+c->edges.count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                    ,0xa84,
                    "int ConvexDecomposition::overhull(Plane *, int, float3 *, int, int, float3 *&, int &, int *&, int &, float)"
                   );
    }
    lVar9 = 0;
    *local_60 = (convex->vertices).element;
    iVar11 = (convex->vertices).count;
    *verts_count_out = iVar11;
    for (lVar15 = 0; lVar15 < iVar11; lVar15 = lVar15 + 1) {
      pfVar7 = Array<ConvexDecomposition::float3>::operator[](&convex->vertices,(int)lVar15);
      fVar18 = pfVar7->z;
      pfVar4 = *ppfVar3;
      *(undefined8 *)((long)&pfVar4->x + lVar9) = *(undefined8 *)pfVar7;
      *(float *)((long)&pfVar4->z + lVar9) = fVar18;
      lVar9 = lVar9 + 0xc;
      iVar11 = (convex->vertices).count;
    }
    (convex->vertices).element = (float3 *)0x0;
    (convex->vertices).count = 0;
    (convex->vertices).array_size = 0;
    ConvexH::~ConvexH(convex);
    ::operator_delete(convex,0x30);
    iVar11 = 1;
  }
  return iVar11;
}

Assistant:

int overhull(Plane *planes,int planes_count,float3 *verts, int verts_count,int maxplanes, 
			 float3 *&verts_out, int &verts_count_out,  int *&faces_out, int &faces_count_out ,float inflate)
{
	int i,j;
	if(verts_count <4) return 0;
	maxplanes = Min(maxplanes,planes_count);
	float3 bmin(verts[0]),bmax(verts[0]);
	for(i=0;i<verts_count;i++) 
	{
		bmin = VectorMin(bmin,verts[i]);
		bmax = VectorMax(bmax,verts[i]);
	}
//	float diameter = magnitude(bmax-bmin);
//	inflate *=diameter;   // RELATIVE INFLATION
	bmin -= float3(inflate,inflate,inflate);
	bmax += float3(inflate,inflate,inflate);
	for(i=0;i<planes_count;i++)
	{
		planes[i].dist -= inflate;
	}
	float3 emin = bmin; // VectorMin(bmin,float3(0,0,0));
	float3 emax = bmax; // VectorMax(bmax,float3(0,0,0));
	float epsilon  = magnitude(emax-emin) * 0.025f;
	planetestepsilon = magnitude(emax-emin) * PAPERWIDTH;
	// todo: add bounding cube planes to force bevel. or try instead not adding the diameter expansion ??? must think.
	// ConvexH *convex = ConvexHMakeCube(bmin - float3(diameter,diameter,diameter),bmax+float3(diameter,diameter,diameter));
	ConvexH *c = ConvexHMakeCube(REAL3(bmin),REAL3(bmax)); 
	int k;
	while(maxplanes-- && (k=candidateplane(planes,planes_count,c,epsilon))>=0)
	{
		ConvexH *tmp = c;
		c = ConvexHCrop(*tmp,planes[k]);
		if(c==NULL) {c=tmp; break;} // might want to debug this case better!!!
		if(!AssertIntact(*c)) {c=tmp; break;} // might want to debug this case better too!!!
		delete tmp;
	}

	assert(AssertIntact(*c));
	//return c;
	faces_out = (int*)malloc(sizeof(int)*(1+c->facets.count+c->edges.count));     // new int[1+c->facets.count+c->edges.count];
	faces_count_out=0;
	i=0;
	faces_out[faces_count_out++]=-1;
	k=0;
	while(i<c->edges.count)
	{
		j=1;
		while(j+i<c->edges.count && c->edges[i].p==c->edges[i+j].p) { j++; }
		faces_out[faces_count_out++]=j;
		while(j--)
		{
			faces_out[faces_count_out++] = c->edges[i].v;
			i++;
		}
		k++;
	}
	faces_out[0]=k; // number of faces.
	assert(k==c->facets.count);
	assert(faces_count_out == 1+c->facets.count+c->edges.count);
	verts_out = c->vertices.element; // new float3[c->vertices.count]; 
	verts_count_out = c->vertices.count;
	for(i=0;i<c->vertices.count;i++)
	{
		verts_out[i] = float3(c->vertices[i]);
	}
	c->vertices.count=c->vertices.array_size=0;	c->vertices.element=NULL;
	delete c;
	return 1;
}